

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delta.c
# Opt level: O2

void Delta_Decode(Byte *state,uint delta,Byte *data,SizeT size)

{
  Byte BVar1;
  Byte BVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  Byte buf [256];
  Byte local_128 [256];
  
  MyMemCpy(local_128,state,delta);
  uVar3 = 0;
  uVar5 = 0;
  while (uVar4 = uVar5, uVar4 < size) {
    for (uVar3 = 0; (uVar5 = uVar4 + uVar3, uVar3 < delta && (uVar5 < size)); uVar3 = uVar3 + 1) {
      BVar1 = data[uVar3 + uVar4];
      BVar2 = local_128[uVar3];
      data[uVar3 + uVar4] = BVar1 + BVar2;
      local_128[uVar3] = BVar1 + BVar2;
    }
  }
  uVar5 = 0;
  if ((uint)uVar3 != delta) {
    uVar5 = uVar3 & 0xffffffff;
  }
  MyMemCpy(state,local_128 + uVar5,delta - (uint)uVar5);
  MyMemCpy(state + (delta - uVar5),local_128,(uint)uVar5);
  return;
}

Assistant:

void Delta_Decode(Byte *state, unsigned delta, Byte *data, SizeT size)
{
  Byte buf[DELTA_STATE_SIZE];
  unsigned j = 0;
  MyMemCpy(buf, state, delta);
  {
    SizeT i;
    for (i = 0; i < size;)
    {
      for (j = 0; j < delta && i < size; i++, j++)
      {
        buf[j] = data[i] = (Byte)(buf[j] + data[i]);
      }
    }
  }
  if (j == delta)
    j = 0;
  MyMemCpy(state, buf + j, delta - j);
  MyMemCpy(state + delta - j, buf, j);
}